

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.h
# Opt level: O0

bool pbrt::ParseArg<int*>
               (char ***argv,string *name,int *out,
               function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *onError)

{
  byte bVar1;
  byte bVar2;
  undefined1 uVar3;
  string *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  int *in_RDX;
  long *in_RDI;
  string value;
  string arg;
  string *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0c;
  undefined1 in_stack_fffffffffffffe0d;
  undefined1 in_stack_fffffffffffffe0e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  allocator<char> *fmt;
  allocator<char> *in_stack_fffffffffffffe30;
  string *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [36];
  undefined4 local_144;
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [55];
  allocator<char> local_49;
  string local_48 [40];
  int *local_20;
  long *local_10;
  byte local_1;
  
  args = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)*in_RDI;
  fmt = &local_49;
  local_20 = in_RDX;
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  std::allocator<char>::~allocator(&local_49);
  psVar4 = (string *)std::__cxx11::string::operator[]((ulong)local_48);
  if (psVar4->_M_dataplus == (_Alloc_hider)0x2d) {
    std::__cxx11::string::substr((ulong)local_80,(ulong)local_48);
    std::__cxx11::string::operator=(local_48,local_80);
    std::__cxx11::string::~string(local_80);
  }
  else {
    std::__cxx11::string::substr((ulong)local_a0,(ulong)local_48);
    std::__cxx11::string::operator=(local_48,local_a0);
    std::__cxx11::string::~string(local_a0);
  }
  anon_unknown_14::normalizeArg(in_stack_fffffffffffffe38);
  std::operator+(in_RCX,(char)((ulong)psVar4 >> 0x38));
  anon_unknown_14::normalizeArg(in_stack_fffffffffffffe38);
  bVar1 = anon_unknown_14::matchPrefix(in_RCX,psVar4);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_100);
  std::__cxx11::string::~string(local_c0);
  if ((bVar1 & 1) == 0) {
    anon_unknown_14::normalizeArg(in_stack_fffffffffffffe38);
    anon_unknown_14::normalizeArg(in_stack_fffffffffffffe38);
    bVar2 = std::operator==(args,in_RCX);
    std::__cxx11::string::~string(local_188);
    std::__cxx11::string::~string(local_168);
    if ((bVar2 & 1) == 0) {
      local_1 = 0;
      local_144 = 1;
    }
    else {
      *local_10 = *local_10 + 8;
      uVar3 = (anonymous_namespace)::enable<int*>(local_20);
      if ((bool)uVar3) {
        local_1 = 1;
        local_144 = 1;
      }
      else if (*(long *)*local_10 == 0) {
        StringPrintf<std::__cxx11::string&>((char *)fmt,args);
        std::
        function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
        ::operator()((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                      *)psVar4,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(bVar1,CONCAT16(in_stack_fffffffffffffe0e,
                                             CONCAT15(bVar2,CONCAT14(uVar3,in_stack_fffffffffffffe08
                                                                    )))));
        std::__cxx11::string::~string(local_1a8);
        local_1 = 0;
        local_144 = 1;
      }
      else {
        psVar4 = *(string **)*local_10;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38,
                   in_stack_fffffffffffffe30);
        anon_unknown_14::initArg(psVar4,(int *)0x4f180f);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffe38);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe37);
        *local_10 = *local_10 + 8;
        local_1 = 1;
        local_144 = 1;
      }
    }
  }
  else {
    *local_10 = *local_10 + 8;
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_120,(ulong)local_48);
    local_1 = anon_unknown_14::initArg(in_stack_fffffffffffffdf8,(int *)0x4f153e);
    if (!(bool)local_1) {
      uVar3 = local_1;
      StringPrintf<std::__cxx11::string&,std::__cxx11::string_const&>((char *)fmt,args,in_RCX);
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::operator()((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                    *)psVar4,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(bVar1,CONCAT16(uVar3,CONCAT15(in_stack_fffffffffffffe0d,
                                                          CONCAT14(in_stack_fffffffffffffe0c,
                                                                   in_stack_fffffffffffffe08)))));
      std::__cxx11::string::~string(local_140);
    }
    local_144 = 1;
    std::__cxx11::string::~string(local_120);
  }
  std::__cxx11::string::~string(local_48);
  return (bool)(local_1 & 1);
}

Assistant:

bool ParseArg(char ***argv, const std::string &name, T out,
              std::function<void(std::string)> onError) {
    std::string arg = **argv;

    // Strip either one or two leading dashes.
    if (arg[1] == '-')
        arg = arg.substr(2);
    else
        arg = arg.substr(1);

    if (matchPrefix(normalizeArg(arg), normalizeArg(name + '='))) {
        // --arg=value
        *argv += 1;
        std::string value = arg.substr(name.size() + 1);
        if (!initArg(value, out)) {
            onError(StringPrintf("invalid value \"%s\" for %s argument", value, name));
            return false;
        }
        return true;
    } else if (normalizeArg(arg) == normalizeArg(name)) {
        // --arg <value>, except for bool arguments, which are set to true
        // without expecting another argument.
        *argv += 1;
        if (enable(out))
            return true;

        if (**argv == nullptr) {
            onError(StringPrintf("missing value after %s argument", arg));
            return false;
        }
        initArg(**argv, out);
        *argv += 1;
        return true;
    } else
        return false;
}